

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_xmlmodelserialiser.cpp
# Opt level: O2

void __thiscall tst_XmlModelSerialiser::basicSaveLoadNested(tst_XmlModelSerialiser *this)

{
  QAbstractItemModel *a;
  QAbstractItemModel *b;
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined8 *puVar4;
  QXmlStreamWriter writeNestedStream;
  QXmlStreamReader readNestedStream;
  QTemporaryFile serialisedXmlNested;
  XmlModelSerialiser serialiser;
  Data *local_58;
  char16_t *pcStack_50;
  QAbstractItemModel *local_48;
  Data *local_38;
  char16_t *local_30;
  QAbstractItemModel *pQStack_28;
  
  iVar3 = qMetaTypeId<QAbstractItemModel_const*>();
  puVar4 = (undefined8 *)QTest::qData("sourceModel",iVar3);
  a = (QAbstractItemModel *)*puVar4;
  iVar3 = qMetaTypeId<QAbstractItemModel*>();
  puVar4 = (undefined8 *)QTest::qData("destinationModel",iVar3);
  b = (QAbstractItemModel *)*puVar4;
  XmlModelSerialiser::XmlModelSerialiser(&serialiser,a,(QObject *)0x0);
  AbstractModelSerialiser::addRoleToSave((int)&serialiser);
  QTemporaryFile::QTemporaryFile(&serialisedXmlNested);
  bVar1 = (bool)(**(code **)(_serialisedXmlNested + 0x68))(&serialisedXmlNested,3);
  cVar2 = QTest::qVerify(bVar1,"serialisedXmlNested.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                         ,0x49);
  if (cVar2 != '\0') {
    QXmlStreamWriter::QXmlStreamWriter(&writeNestedStream,(QIODevice *)&serialisedXmlNested);
    QXmlStreamWriter::writeStartDocument();
    local_38 = (Data *)0x0;
    local_30 = L"NestForModel";
    pQStack_28 = (QAbstractItemModel *)0xc;
    local_58 = (Data *)0x0;
    pcStack_50 = (char16_t *)0x0;
    local_48 = (QAbstractItemModel *)0x0;
    QXmlStreamWriter::writeStartElement((QString *)&writeNestedStream);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    XmlModelSerialiser::setPrintStartDocument(SUB81(&serialiser,0));
    bVar1 = (bool)XmlModelSerialiser::saveModel((QXmlStreamWriter *)&serialiser);
    cVar2 = QTest::qVerify(bVar1,"serialiser.saveModel(writeNestedStream)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                           ,0x4e);
    if (cVar2 != '\0') {
      QXmlStreamWriter::writeEndElement();
      bVar1 = (bool)QFileDevice::seek((longlong)&serialisedXmlNested);
      cVar2 = QTest::qVerify(bVar1,"serialisedXmlNested.seek(0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                             ,0x50);
      if (cVar2 != '\0') {
        QXmlStreamReader::QXmlStreamReader(&readNestedStream,(QIODevice *)&serialisedXmlNested);
        AbstractModelSerialiser::setModel((QAbstractItemModel *)&serialiser);
        bVar1 = (bool)XmlModelSerialiser::loadModel((QXmlStreamReader *)&serialiser);
        cVar2 = QTest::qVerify(bVar1,"serialiser.loadModel(readNestedStream)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                               ,0x53);
        if (cVar2 != '\0') {
          QFileDevice::close();
          local_38 = (Data *)0xffffffffffffffff;
          local_30 = (char16_t *)0x0;
          pQStack_28 = (QAbstractItemModel *)0x0;
          local_58 = (Data *)0xffffffffffffffff;
          pcStack_50 = (char16_t *)0x0;
          local_48 = (QAbstractItemModel *)0x0;
          tst_SerialiserCommon::checkModelEqual
                    (&this->super_tst_SerialiserCommon,a,b,(QModelIndex *)&local_38,
                     (QModelIndex *)&local_58,true);
          QObject::deleteLater();
        }
        QXmlStreamReader::~QXmlStreamReader(&readNestedStream);
      }
    }
    QXmlStreamWriter::~QXmlStreamWriter(&writeNestedStream);
  }
  QTemporaryFile::~QTemporaryFile(&serialisedXmlNested);
  XmlModelSerialiser::~XmlModelSerialiser(&serialiser);
  return;
}

Assistant:

void tst_XmlModelSerialiser::basicSaveLoadNested()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QFETCH(QAbstractItemModel *, destinationModel);
    XmlModelSerialiser serialiser(sourceModel, nullptr);
    serialiser.addRoleToSave(Qt::UserRole + 1);
    QTemporaryFile serialisedXmlNested;
    QVERIFY(serialisedXmlNested.open());
    QXmlStreamWriter writeNestedStream(&serialisedXmlNested);
    writeNestedStream.writeStartDocument();
    writeNestedStream.writeStartElement(QStringLiteral("NestForModel"));
    serialiser.setPrintStartDocument(false);
    QVERIFY(serialiser.saveModel(writeNestedStream));
    writeNestedStream.writeEndElement(); // NestForModel
    QVERIFY(serialisedXmlNested.seek(0));
    QXmlStreamReader readNestedStream(&serialisedXmlNested);
    serialiser.setModel(destinationModel);
    QVERIFY(serialiser.loadModel(readNestedStream));
    serialisedXmlNested.close();
    checkModelEqual(sourceModel, destinationModel);
    destinationModel->deleteLater();
}